

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O0

void __thiscall DIS::CollisionPdu::marshal(CollisionPdu *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  CollisionPdu *this_local;
  
  EntityInformationFamilyPdu::marshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::marshal(&this->_issuingEntityID,dataStream);
  EntityID::marshal(&this->_collidingEntityID,dataStream);
  EventID::marshal(&this->_eventID,dataStream);
  DataStream::operator<<(dataStream,this->_collisionType);
  DataStream::operator<<(dataStream,this->_pad);
  Vector3Float::marshal(&this->_velocity,dataStream);
  DataStream::operator<<(dataStream,this->_mass);
  Vector3Float::marshal(&this->_location,dataStream);
  return;
}

Assistant:

void CollisionPdu::marshal(DataStream& dataStream) const
{
    EntityInformationFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _issuingEntityID.marshal(dataStream);
    _collidingEntityID.marshal(dataStream);
    _eventID.marshal(dataStream);
    dataStream << _collisionType;
    dataStream << _pad;
    _velocity.marshal(dataStream);
    dataStream << _mass;
    _location.marshal(dataStream);
}